

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O2

void __thiscall TasgridWrapper::processEvalLike(TasgridWrapper *this)

{
  TypeCommand TVar1;
  pointer pdVar2;
  byte bVar3;
  int new_stride;
  runtime_error *this_00;
  vector<int,_std::allocator<int>_> *__n;
  void *__buf;
  int i;
  long lVar4;
  Data2D<double> x;
  Data2D<double> result;
  internal_sparse_matrix matrix;
  _Vector_base<double,_std::allocator<double>_> local_38;
  
  new_stride = TasGrid::TasmanianSparseGrid::getNumPoints(&this->grid);
  if (this->pass_flag != true) {
    return;
  }
  verifiedRead(&x,this,&this->xfilename,this->num_dimensions);
  pdVar2 = x.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
           ._M_end_of_storage;
  result.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  result.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  result.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  result.stride = 0;
  result.num_strips = 0;
  TVar1 = this->command;
  switch(TVar1) {
  case command_getinterweights:
    TasGrid::Data2D<double>::Data2D<int,int>
              ((Data2D<double> *)&matrix,new_stride,(uint)x.num_strips);
    TasGrid::Data2D<double>::operator=(&result,(Data2D<double> *)&matrix);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)
               &matrix.pntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish);
    for (lVar4 = 0; lVar4 < (int)(uint)x.num_strips; lVar4 = lVar4 + 1) {
      TasGrid::TasmanianSparseGrid::getInterpolationWeights
                ((double *)this,
                 x.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + x.stride * lVar4);
    }
    break;
  case command_getdiffweights:
    TasGrid::Data2D<double>::Data2D<int,int>
              ((Data2D<double> *)&matrix,this->num_dimensions * new_stride,(uint)x.num_strips);
    TasGrid::Data2D<double>::operator=(&result,(Data2D<double> *)&matrix);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)
               &matrix.pntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish);
    for (lVar4 = 0; lVar4 < (int)(uint)x.num_strips; lVar4 = lVar4 + 1) {
      TasGrid::TasmanianSparseGrid::getDifferentiationWeights
                ((double *)this,
                 x.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + x.stride * lVar4);
    }
    break;
  case command_getpoints:
  case command_getneeded:
  case command_loadvalues:
  case command_integrate:
switchD_0012d053_caseD_d:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"ERROR: internal problem, processEvalLike() called with wrong command");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case command_evaluate:
    TasGrid::Data2D<double>::Data2D<int,int>
              ((Data2D<double> *)&matrix,this->num_outputs,(uint)x.num_strips);
    TasGrid::Data2D<double>::operator=(&result,(Data2D<double> *)&matrix);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)
               &matrix.pntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish);
    TasGrid::TasmanianSparseGrid::evaluateBatch
              ((double *)this,
               (int)x.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,(double *)(ulong)(uint)x.num_strips);
    break;
  case command_differentiate:
    TasGrid::Data2D<double>::Data2D<int,int>
              ((Data2D<double> *)&matrix,this->num_dimensions * this->num_outputs,(uint)x.num_strips
              );
    TasGrid::Data2D<double>::operator=(&result,(Data2D<double> *)&matrix);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)
               &matrix.pntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish);
    for (lVar4 = 0; lVar4 < (int)(uint)x.num_strips; lVar4 = lVar4 + 1) {
      TasGrid::TasmanianSparseGrid::differentiate
                ((double *)this,
                 x.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + x.stride * lVar4);
    }
    break;
  default:
    if (TVar1 == command_evalhierarchical_sparse) {
      matrix.pntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      matrix.pntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      matrix.pntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      matrix.indx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      matrix.indx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      matrix.indx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      matrix.vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      matrix.vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      matrix.vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_38._M_impl.super__Vector_impl_data._M_start =
           x.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
           ._M_start;
      local_38._M_impl.super__Vector_impl_data._M_finish =
           x.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
           ._M_finish;
      x.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_38._M_impl.super__Vector_impl_data._M_end_of_storage = pdVar2;
      x.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      x.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      __n = &matrix.indx;
      matrix.num_cols = new_stride;
      TasGrid::TasmanianSparseGrid::evaluateSparseHierarchicalFunctions
                ((vector *)this,(vector *)&local_38,(vector *)&matrix.pntr,(vector *)__n);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_38);
      internal_sparse_matrix::write
                (&matrix,(int)this + 0x180,(void *)(ulong)this->useASCII,(size_t)__n);
      internal_sparse_matrix::write(&matrix,(uint)this->printCout,__buf,(size_t)__n);
      internal_sparse_matrix::~internal_sparse_matrix(&matrix);
      goto LAB_0012d31c;
    }
    if (TVar1 != command_evalhierarchical_dense) goto switchD_0012d053_caseD_d;
    if (*(long **)&this->field_0x8 == (long *)0x0) {
      bVar3 = 0;
    }
    else {
      bVar3 = (**(code **)(**(long **)&this->field_0x8 + 0x30))();
    }
    TasGrid::Data2D<double>::Data2D<int,int>
              ((Data2D<double> *)&matrix,new_stride << (bVar3 & 0x1f),(uint)x.num_strips);
    TasGrid::Data2D<double>::operator=(&result,(Data2D<double> *)&matrix);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)
               &matrix.pntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish);
    TasGrid::TasmanianSparseGrid::evaluateHierarchicalFunctions
              ((double *)this,
               (int)x.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,(double *)(ulong)(uint)x.num_strips);
  }
  writeMatrix<double>(this,&this->outfilename,&result);
  printMatrix<double>(this,&result,false);
LAB_0012d31c:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&result.vec.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&x.vec.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void TasgridWrapper::processEvalLike() const{
    int num_points = grid.getNumPoints();
    if (not pass_flag) return;

    auto x = verifiedRead(xfilename, num_dimensions);

    Data2D<double> result;
    switch(command){
        case command_evaluate:
            result = Data2D<double>(num_outputs, x.getNumStrips());
            grid.evaluateBatch(x.data(), x.getNumStrips(), result.data());
            break;
        case command_differentiate:
            result = Data2D<double>(num_outputs * num_dimensions, x.getNumStrips());
            #pragma omp parallel for
            for (int i=0; i<x.getNumStrips(); i++)
                grid.differentiate(x.getStrip(i), result.getStrip(i));
            break;
        case command_getinterweights:
            result = Data2D<double>(num_points, x.getNumStrips());
            #pragma omp parallel for
            for(int i=0; i<x.getNumStrips(); i++)
                grid.getInterpolationWeights(x.getStrip(i), result.getStrip(i));
            break;
        case command_getdiffweights:
            result = Data2D<double>(num_points * num_dimensions, x.getNumStrips());
            #pragma omp parallel for
            for(int i=0; i<x.getNumStrips(); i++)
                grid.getDifferentiationWeights(x.getStrip(i), result.getStrip(i));
            break;
        case command_evalhierarchical_dense:
            result = Data2D<double>(num_points * (grid.isFourier() ? 2 : 1), x.getNumStrips());
            grid.evaluateHierarchicalFunctions(x.data(), x.getNumStrips(), result.data());
            break;
        case command_evalhierarchical_sparse:
        { // scope is needed to declare sparse variables
            internal_sparse_matrix matrix(num_points);
            grid.evaluateSparseHierarchicalFunctions(x.release(), matrix.pntr, matrix.indx, matrix.vals);
            matrix.write(outfilename, useASCII);
            matrix.write(printCout);
            return; // after this, there is output section but invalid for this command
        }
            break;
        default:
            throw std::runtime_error("ERROR: internal problem, processEvalLike() called with wrong command");
            break;
    }

    writeMatrix(outfilename, result);
    printMatrix(result);
}